

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O2

bool __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<5>::
EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<5> *this,PointDVectorIterator begin,
          PointDVectorIterator end,uint32_t *bit_length,EncoderBuffer *buffer)

{
  this->bit_length_ = *bit_length;
  this->num_points_ = (int)end.item_ - (int)begin.item_;
  EncoderBuffer::Encode<unsigned_int>(buffer,&this->bit_length_);
  EncoderBuffer::Encode<unsigned_int>(buffer,&this->num_points_);
  if (this->num_points_ != 0) {
    FoldedBit32Encoder<draco::RAnsBitEncoder>::StartEncoding(&this->numbers_encoder_);
    DirectBitEncoder::StartEncoding(&this->remaining_bits_encoder_);
    DirectBitEncoder::StartEncoding(&this->axis_encoder_);
    DirectBitEncoder::StartEncoding(&this->half_encoder_);
    EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>(this,begin,end);
    FoldedBit32Encoder<draco::RAnsBitEncoder>::EndEncoding(&this->numbers_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->remaining_bits_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->axis_encoder_,buffer);
    DirectBitEncoder::EndEncoding(&this->half_encoder_,buffer);
  }
  return true;
}

Assistant:

bool DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodePoints(
    RandomAccessIteratorT begin, RandomAccessIteratorT end,
    const uint32_t &bit_length, EncoderBuffer *buffer) {
  bit_length_ = bit_length;
  num_points_ = static_cast<uint32_t>(end - begin);

  buffer->Encode(bit_length_);
  buffer->Encode(num_points_);
  if (num_points_ == 0) {
    return true;
  }

  numbers_encoder_.StartEncoding();
  remaining_bits_encoder_.StartEncoding();
  axis_encoder_.StartEncoding();
  half_encoder_.StartEncoding();

  EncodeInternal(begin, end);

  numbers_encoder_.EndEncoding(buffer);
  remaining_bits_encoder_.EndEncoding(buffer);
  axis_encoder_.EndEncoding(buffer);
  half_encoder_.EndEncoding(buffer);

  return true;
}